

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmNinjaTargetGenerator::WriteObjectBuildStatements
          (cmNinjaTargetGenerator *this,string *config,string *fileConfig,bool firstForConfig)

{
  _Rb_tree_node_base *lang;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
  *this_00;
  cmOSXBundleGenerator *pcVar1;
  cmMakefile *this_01;
  cmSourceFile *this_02;
  cmCustomCommand *pcVar2;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var3;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  computeInternalDepfile;
  pointer ppcVar5;
  bool bVar6;
  TargetType targetType;
  cmGeneratedFileStream *pcVar7;
  ostream *poVar8;
  string *psVar9;
  mapped_type *pmVar10;
  cmValue suffix;
  cmGlobalNinjaGenerator *pcVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar13;
  MapToNinjaPathImpl MVar14;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  _Base_ptr p_Var15;
  pointer ppcVar16;
  cmCustomCommand *pcVar17;
  pointer ppcVar18;
  string_view str;
  undefined8 in_stack_fffffffffffffc00;
  string local_3d0;
  pointer local_3b0;
  string tgtDir;
  _Any_data local_388;
  undefined8 local_378;
  undefined8 uStack_370;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> customCommands;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> local_328 [72];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2e0 [2];
  cmNinjaDeps local_2b0 [7];
  cmCustomCommand *cc;
  cmCustomCommand *pcStack_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8 [3];
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> local_1c8 [120];
  cmNinjaDeps local_150 [4];
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  string local_c0;
  cmAlphaNum local_a0;
  string local_70;
  string local_50;
  
  cmGeneratorTarget::CheckCxxModuleStatus
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,config);
  pcVar7 = GetImplFileStream(this,fileConfig);
  cmGlobalNinjaGenerator::WriteDivider((ostream *)pcVar7);
  pcVar7 = GetImplFileStream(this,fileConfig);
  poVar8 = std::operator<<((ostream *)pcVar7,"# Object build statements for ");
  targetType = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget);
  psVar9 = cmState::GetTargetTypeName_abi_cxx11_(targetType);
  poVar8 = std::operator<<(poVar8,(string *)psVar9);
  poVar8 = std::operator<<(poVar8," target ");
  GetTargetName_abi_cxx11_((string *)&customCommands,this);
  poVar8 = std::operator<<(poVar8,(string *)&customCommands);
  std::operator<<(poVar8,"\n\n");
  std::__cxx11::string::~string((string *)&customCommands);
  customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGeneratorTarget::GetCustomCommands
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,&customCommands,config);
  ppcVar5 = customCommands.
            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  this_00 = &this->Configs;
  for (ppcVar18 = customCommands.
                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppcVar18 != ppcVar5;
      ppcVar18 = ppcVar18 + 1) {
    cc = cmSourceFile::GetCustomCommand(*ppcVar18);
    cmLocalNinjaGenerator::AddCustomCommandTarget
              (this->LocalGenerator,cc,(this->super_cmCommonTargetGenerator).GeneratorTarget);
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
              ::operator[](this_00,config);
    std::vector<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>::push_back
              (&pmVar10->CustomCommands,&cc);
  }
  std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
            (&customCommands.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>);
  customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGeneratorTarget::GetHeaderSources
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,&customCommands,config);
  pcVar1 = (this->OSXBundleGenerator)._M_t.
           super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>.
           _M_t.
           super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>
           .super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl;
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
            ::operator[](this_00,fileConfig);
  cmOSXBundleGenerator::GenerateMacOSXContentStatements
            (pcVar1,&customCommands,
             &((pmVar10->MacOSXContentGenerator)._M_t.
               super___uniq_ptr_impl<cmNinjaTargetGenerator::MacOSXContentGeneratorType,_std::default_delete<cmNinjaTargetGenerator::MacOSXContentGeneratorType>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmNinjaTargetGenerator::MacOSXContentGeneratorType_*,_std::default_delete<cmNinjaTargetGenerator::MacOSXContentGeneratorType>_>
               .super__Head_base<0UL,_cmNinjaTargetGenerator::MacOSXContentGeneratorType_*,_false>.
              _M_head_impl)->super_MacOSXContentGeneratorType,config);
  std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
            (&customCommands.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>);
  customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGeneratorTarget::GetExtraSources
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,&customCommands,config);
  pcVar1 = (this->OSXBundleGenerator)._M_t.
           super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>.
           _M_t.
           super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>
           .super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl;
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
            ::operator[](this_00,fileConfig);
  cmOSXBundleGenerator::GenerateMacOSXContentStatements
            (pcVar1,&customCommands,
             &((pmVar10->MacOSXContentGenerator)._M_t.
               super___uniq_ptr_impl<cmNinjaTargetGenerator::MacOSXContentGeneratorType,_std::default_delete<cmNinjaTargetGenerator::MacOSXContentGeneratorType>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmNinjaTargetGenerator::MacOSXContentGeneratorType_*,_std::default_delete<cmNinjaTargetGenerator::MacOSXContentGeneratorType>_>
               .super__Head_base<0UL,_cmNinjaTargetGenerator::MacOSXContentGeneratorType_*,_false>.
              _M_head_impl)->super_MacOSXContentGeneratorType,config);
  std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
            (&customCommands.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>);
  if (firstForConfig) {
    this_01 = (this->super_cmCommonTargetGenerator).Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&customCommands,"CMAKE_PCH_EXTENSION",(allocator<char> *)&cc);
    suffix = cmMakefile::GetDefinition(this_01,(string *)&customCommands);
    std::__cxx11::string::~string((string *)&customCommands);
    cc = (cmCustomCommand *)0x0;
    pcStack_200 = (cmCustomCommand *)0x0;
    local_1f8[0]._M_allocated_capacity = (pointer)0x0;
    cmGeneratorTarget::GetExternalObjects
              ((this->super_cmCommonTargetGenerator).GeneratorTarget,
               (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&cc,config);
    pcVar2 = pcStack_200;
    for (pcVar17 = cc; pcVar17 != pcVar2;
        pcVar17 = (cmCustomCommand *)
                  &(pcVar17->Outputs).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
      this_02 = (cmSourceFile *)
                (pcVar17->Outputs).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pcVar11 = GetGlobalGenerator(this);
      psVar9 = cmSourceFile::GetFullPath_abi_cxx11_(this_02);
      psVar9 = ConvertToNinjaPath(this,psVar9);
      (*(pcVar11->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
        [0x16])((value_type *)&customCommands,pcVar11,psVar9,config);
      str._M_str = (char *)customCommands.
                           super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                           ._M_impl.super__Vector_impl_data._M_start;
      str._M_len = (size_t)customCommands.
                           super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
      bVar6 = cmHasSuffix(str,suffix);
      if (!bVar6) {
        pmVar10 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
                  ::operator[](this_00,config);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&pmVar10->Objects,(value_type *)&customCommands);
      }
      std::__cxx11::string::~string((string *)&customCommands);
    }
    std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
              ((_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&cc);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"phony",(allocator<char> *)&customCommands);
  cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)&cc,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x1c;
  customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)anon_var_dwarf_118df77;
  GetTargetName_abi_cxx11_(&local_3d0,this);
  local_a0.View_._M_len = local_3d0._M_string_length;
  local_a0.View_._M_str = local_3d0._M_dataplus._M_p;
  cmStrCat<>(&tgtDir,(cmAlphaNum *)&customCommands,&local_a0);
  std::__cxx11::string::operator=((string *)&cc,(string *)&tgtDir);
  std::__cxx11::string::~string((string *)&tgtDir);
  std::__cxx11::string::~string((string *)&local_3d0);
  OrderDependsTargetForTarget((string *)&customCommands,this,config);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            (local_1c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&customCommands);
  std::__cxx11::string::~string((string *)&customCommands);
  cmLocalNinjaGenerator::AppendTargetDepends
            (this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget,local_150,
             config,fileConfig,DependOnTargetOrdering);
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
            ::operator[](this_00,config);
  ::cm::
  append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
            (local_150,&pmVar10->ExtraFiles);
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
            ::operator[](this_00,config);
  ppcVar16 = (pmVar10->CustomCommands).
             super__Vector_base<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_3b0 = (pmVar10->CustomCommands).
              super__Vector_base<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (ppcVar16 == local_3b0) break;
    pcVar2 = *ppcVar16;
    std::__cxx11::string::string((string *)&local_c0,(string *)config);
    local_e8._M_engaged = false;
    local_388._M_unused._M_object = (void *)0x0;
    local_388._8_8_ = 0;
    local_378 = 0;
    uStack_370 = 0;
    computeInternalDepfile.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffc00;
    computeInternalDepfile.super__Function_base._M_functor._M_unused._M_object = &local_388;
    computeInternalDepfile.super__Function_base._M_manager = (_Manager_type)config;
    computeInternalDepfile._M_invoker = (_Invoker_type)fileConfig;
    cmCustomCommandGenerator::cmCustomCommandGenerator
              ((cmCustomCommandGenerator *)&customCommands,pcVar2,&local_c0,
               (cmLocalGenerator *)this->LocalGenerator,true,
               (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_e8,computeInternalDepfile);
    std::_Function_base::~_Function_base((_Function_base *)&local_388);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset(&local_e8);
    std::__cxx11::string::~string((string *)&local_c0);
    pvVar12 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_
                        ((cmCustomCommandGenerator *)&customCommands);
    pvVar13 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_
                        ((cmCustomCommandGenerator *)&customCommands);
    _Var3._M_current =
         (pvVar12->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
    _Var4._M_current =
         (pvVar12->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    MVar14.GG = GetGlobalGenerator(this);
    std::
    transform<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
              (_Var3,_Var4,local_150,MVar14);
    _Var3._M_current =
         (pvVar13->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
    _Var4._M_current =
         (pvVar13->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    MVar14.GG = GetGlobalGenerator(this);
    std::
    transform<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
              (_Var3,_Var4,local_150,MVar14);
    cmCustomCommandGenerator::~cmCustomCommandGenerator((cmCustomCommandGenerator *)&customCommands)
    ;
    ppcVar16 = ppcVar16 + 1;
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_150[0].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             local_150[0].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  __first = std::
            __unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                      (local_150[0].
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       local_150[0].
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::erase(local_150,(const_iterator)__first._M_current,
          (const_iterator)
          local_150[0].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish);
  if (local_150[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_150[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    psVar9 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                       ((cmLocalGenerator *)this->LocalGenerator);
    customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)(psVar9->_M_dataplus)._M_p;
    customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)psVar9->_M_string_length;
    local_a0.View_._M_str = local_a0.Digits_;
    local_a0.View_._M_len = 1;
    local_a0.Digits_[0] = '/';
    (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
      _vptr_cmLocalGenerator[0xe])
              (&local_3d0,this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget
              );
    cmStrCat<std::__cxx11::string>(&tgtDir,(cmAlphaNum *)&customCommands,&local_a0,&local_3d0);
    std::__cxx11::string::~string((string *)&local_3d0);
    psVar9 = ConvertToNinjaPath(this,&tgtDir);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_150,psVar9);
    std::__cxx11::string::~string((string *)&tgtDir);
  }
  pcVar11 = GetGlobalGenerator(this);
  pcVar7 = GetImplFileStream(this,fileConfig);
  cmGlobalNinjaGenerator::WriteBuild(pcVar11,(ostream *)pcVar7,(cmNinjaBuild *)&cc,0,(bool *)0x0);
  cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)&cc);
  customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGeneratorTarget::GetObjectSources
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,&customCommands,config);
  ppcVar5 = customCommands.
            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppcVar18 = customCommands.
                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppcVar18 != ppcVar5;
      ppcVar18 = ppcVar18 + 1) {
    WriteObjectBuildStatement(this,*ppcVar18,config,fileConfig,firstForConfig);
  }
  std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
            (&customCommands.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>);
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
            ::operator[](this_00,config);
  p_Var15 = (pmVar10->DDIFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((_Rb_tree_header *)p_Var15 != &(pmVar10->DDIFiles)._M_t._M_impl.super__Rb_tree_header) {
    lang = p_Var15 + 1;
    psVar9 = config;
    LanguageDyndepRule(&local_50,this,(string *)lang,config);
    cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)&customCommands,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    GetDyndepFilePath((string *)&cc,this,(string *)lang,config);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(local_328,(string *)&cc);
    std::__cxx11::string::~string((string *)&cc);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(local_2e0,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(p_Var15 + 2));
    WriteTargetDependInfo(this,(string *)lang,psVar9);
    cmLocalNinjaGenerator::AppendTargetDepends
              (this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget,local_2b0,
               psVar9,fileConfig,DependOnTargetArtifact);
    pcVar11 = GetGlobalGenerator(this);
    pcVar7 = GetImplFileStream(this,fileConfig);
    cmGlobalNinjaGenerator::WriteBuild
              (pcVar11,(ostream *)pcVar7,(cmNinjaBuild *)&customCommands,0,(bool *)0x0);
    cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)&customCommands);
    p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
    config = psVar9;
  }
  pcVar7 = GetImplFileStream(this,fileConfig);
  std::operator<<((ostream *)pcVar7,"\n");
  return;
}

Assistant:

void cmNinjaTargetGenerator::WriteObjectBuildStatements(
  const std::string& config, const std::string& fileConfig,
  bool firstForConfig)
{
  this->GeneratorTarget->CheckCxxModuleStatus(config);

  // Write comments.
  cmGlobalNinjaGenerator::WriteDivider(this->GetImplFileStream(fileConfig));
  this->GetImplFileStream(fileConfig)
    << "# Object build statements for "
    << cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType())
    << " target " << this->GetTargetName() << "\n\n";

  {
    std::vector<cmSourceFile const*> customCommands;
    this->GeneratorTarget->GetCustomCommands(customCommands, config);
    for (cmSourceFile const* sf : customCommands) {
      cmCustomCommand const* cc = sf->GetCustomCommand();
      this->GetLocalGenerator()->AddCustomCommandTarget(
        cc, this->GetGeneratorTarget());
      // Record the custom commands for this target. The container is used
      // in WriteObjectBuildStatement when called in a loop below.
      this->Configs[config].CustomCommands.push_back(cc);
    }
  }
  {
    std::vector<cmSourceFile const*> headerSources;
    this->GeneratorTarget->GetHeaderSources(headerSources, config);
    this->OSXBundleGenerator->GenerateMacOSXContentStatements(
      headerSources, this->Configs[fileConfig].MacOSXContentGenerator.get(),
      config);
  }
  {
    std::vector<cmSourceFile const*> extraSources;
    this->GeneratorTarget->GetExtraSources(extraSources, config);
    this->OSXBundleGenerator->GenerateMacOSXContentStatements(
      extraSources, this->Configs[fileConfig].MacOSXContentGenerator.get(),
      config);
  }
  if (firstForConfig) {
    cmValue pchExtension =
      this->GetMakefile()->GetDefinition("CMAKE_PCH_EXTENSION");

    std::vector<cmSourceFile const*> externalObjects;
    this->GeneratorTarget->GetExternalObjects(externalObjects, config);
    for (cmSourceFile const* sf : externalObjects) {
      auto objectFileName = this->GetGlobalGenerator()->ExpandCFGIntDir(
        this->ConvertToNinjaPath(sf->GetFullPath()), config);
      if (!cmHasSuffix(objectFileName, pchExtension)) {
        this->Configs[config].Objects.push_back(objectFileName);
      }
    }
  }

  {
    cmNinjaBuild build("phony");
    build.Comment =
      cmStrCat("Order-only phony target for ", this->GetTargetName());
    build.Outputs.push_back(this->OrderDependsTargetForTarget(config));

    cmNinjaDeps& orderOnlyDeps = build.OrderOnlyDeps;
    this->GetLocalGenerator()->AppendTargetDepends(
      this->GeneratorTarget, orderOnlyDeps, config, fileConfig,
      DependOnTargetOrdering);

    // Add order-only dependencies on other files associated with the target.
    cm::append(orderOnlyDeps, this->Configs[config].ExtraFiles);

    // Add order-only dependencies on custom command outputs.
    for (cmCustomCommand const* cc : this->Configs[config].CustomCommands) {
      cmCustomCommandGenerator ccg(*cc, config, this->GetLocalGenerator());
      const std::vector<std::string>& ccoutputs = ccg.GetOutputs();
      const std::vector<std::string>& ccbyproducts = ccg.GetByproducts();
      std::transform(ccoutputs.begin(), ccoutputs.end(),
                     std::back_inserter(orderOnlyDeps),
                     this->MapToNinjaPath());
      std::transform(ccbyproducts.begin(), ccbyproducts.end(),
                     std::back_inserter(orderOnlyDeps),
                     this->MapToNinjaPath());
    }

    std::sort(orderOnlyDeps.begin(), orderOnlyDeps.end());
    orderOnlyDeps.erase(
      std::unique(orderOnlyDeps.begin(), orderOnlyDeps.end()),
      orderOnlyDeps.end());

    // The phony target must depend on at least one input or ninja will explain
    // that "output ... of phony edge with no inputs doesn't exist" and
    // consider the phony output "dirty".
    if (orderOnlyDeps.empty()) {
      // Any path that always exists will work here.  It would be nice to
      // use just "." but that is not supported by Ninja < 1.7.
      std::string tgtDir = cmStrCat(
        this->LocalGenerator->GetCurrentBinaryDirectory(), '/',
        this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget));
      orderOnlyDeps.push_back(this->ConvertToNinjaPath(tgtDir));
    }

    this->GetGlobalGenerator()->WriteBuild(this->GetImplFileStream(fileConfig),
                                           build);
  }

  {
    std::vector<cmSourceFile const*> objectSources;
    this->GeneratorTarget->GetObjectSources(objectSources, config);

    for (cmSourceFile const* sf : objectSources) {
      this->WriteObjectBuildStatement(sf, config, fileConfig, firstForConfig);
    }
  }

  for (auto const& langDDIFiles : this->Configs[config].DDIFiles) {
    std::string const& language = langDDIFiles.first;
    cmNinjaDeps const& ddiFiles = langDDIFiles.second;

    cmNinjaBuild build(this->LanguageDyndepRule(language, config));
    build.Outputs.push_back(this->GetDyndepFilePath(language, config));
    build.ExplicitDeps = ddiFiles;

    this->WriteTargetDependInfo(language, config);

    // Make sure dyndep files for all our dependencies have already
    // been generated so that the '<LANG>Modules.json' files they
    // produced as side-effects are available for us to read.
    // Ideally we should depend on the '<LANG>Modules.json' files
    // from our dependencies directly, but we don't know which of
    // our dependencies produces them.  Fixing this will require
    // refactoring the Ninja generator to generate targets in
    // dependency order so that we can collect the needed information.
    this->GetLocalGenerator()->AppendTargetDepends(
      this->GeneratorTarget, build.OrderOnlyDeps, config, fileConfig,
      DependOnTargetArtifact);

    this->GetGlobalGenerator()->WriteBuild(this->GetImplFileStream(fileConfig),
                                           build);
  }

  this->GetImplFileStream(fileConfig) << "\n";
}